

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

ForNonContainerNonPointer<std::__exception_ptr::exception_ptr,_std::string> *
lest::to_string<std::__exception_ptr::exception_ptr>
          (ForNonContainerNonPointer<std::__exception_ptr::exception_ptr,_std::string>
           *__return_storage_ptr__,exception_ptr *item)

{
  ForNonStreamable<std::__exception_ptr::exception_ptr,_std::string> local_30;
  
  make_string<std::__exception_ptr::exception_ptr>(&local_30,item);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == &local_30.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_30.field_2._M_allocated_capacity
    ;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_30.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_30._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_30.field_2._M_allocated_capacity
    ;
  }
  __return_storage_ptr__->_M_string_length = local_30._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

auto to_string( T const & item ) -> ForNonContainerNonPointer<T, std::string>
{
    return make_string( item );
}